

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator_visitor.cpp
# Opt level: O2

void __thiscall
duckdb::LogicalOperatorVisitor::VisitOperatorWithProjectionMapChildren
          (LogicalOperatorVisitor *this,LogicalOperator *op)

{
  LogicalOperatorType LVar1;
  reference pvVar2;
  type pLVar3;
  LogicalOrder *pLVar4;
  LogicalFilter *pLVar5;
  NotImplementedException *this_00;
  vector<unsigned_long,_true> *projection_map;
  allocator local_61;
  string local_60;
  string local_40;
  
  LVar1 = op->type;
  if (2 < LVar1 - 0x33) {
    if (LVar1 == LOGICAL_FILTER) {
      pLVar5 = LogicalOperator::Cast<duckdb::LogicalFilter>(op);
      pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(&op->children,0);
      pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(pvVar2);
      projection_map = &pLVar5->projection_map;
      goto LAB_0131339a;
    }
    if (LVar1 == LOGICAL_ORDER_BY) {
      pLVar4 = LogicalOperator::Cast<duckdb::LogicalOrder>(op);
      pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(&op->children,0);
      pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(pvVar2);
      projection_map = &pLVar4->projection_map;
      goto LAB_0131339a;
    }
    if (LVar1 != LOGICAL_ASOF_JOIN) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"VisitOperatorWithProjectionMapChildren for %s",&local_61);
      EnumUtil::ToString<duckdb::LogicalOperatorType>(&local_60,op->type);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (this_00,&local_40,&local_60);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(&op->children,0);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar2);
  VisitChildOfOperatorWithProjectionMap(this,pLVar3,(vector<unsigned_long,_true> *)&op[1].type);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(&op->children,1);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar2);
  projection_map =
       (vector<unsigned_long,_true> *)
       &op[1].children.
        super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
LAB_0131339a:
  VisitChildOfOperatorWithProjectionMap(this,pLVar3,projection_map);
  return;
}

Assistant:

void LogicalOperatorVisitor::VisitOperatorWithProjectionMapChildren(LogicalOperator &op) {
	D_ASSERT(op.HasProjectionMap());
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_ANY_JOIN:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
	case LogicalOperatorType::LOGICAL_DELIM_JOIN:
	case LogicalOperatorType::LOGICAL_ASOF_JOIN: {
		auto &join = op.Cast<LogicalJoin>();
		VisitChildOfOperatorWithProjectionMap(*op.children[0], join.left_projection_map);
		VisitChildOfOperatorWithProjectionMap(*op.children[1], join.right_projection_map);
		break;
	}
	case LogicalOperatorType::LOGICAL_ORDER_BY: {
		auto &order = op.Cast<LogicalOrder>();
		VisitChildOfOperatorWithProjectionMap(*op.children[0], order.projection_map);
		break;
	}
	case LogicalOperatorType::LOGICAL_FILTER: {
		auto &filter = op.Cast<LogicalFilter>();
		VisitChildOfOperatorWithProjectionMap(*op.children[0], filter.projection_map);
		break;
	}
	default:
		throw NotImplementedException("VisitOperatorWithProjectionMapChildren for %s", EnumUtil::ToString(op.type));
	}
}